

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-stb-truetype.h
# Opt level: O2

void plutovg_font_face_get_metrics
               (plutovg_font_face_t *face,float size,float *ascent,float *descent,float *line_gap,
               plutovg_rect_t *extents)

{
  undefined4 uVar1;
  undefined4 uVar2;
  ushort uVar3;
  int iVar4;
  int iVar5;
  float fVar6;
  
  uVar3 = *(ushort *)((face->info).data + (long)(face->info).head + 0x12);
  fVar6 = size / (float)(ushort)(uVar3 << 8 | uVar3 >> 8);
  if (ascent != (float *)0x0) {
    *ascent = (float)face->ascent * fVar6;
  }
  if (descent != (float *)0x0) {
    *descent = (float)face->descent * fVar6;
  }
  if (line_gap != (float *)0x0) {
    *line_gap = (float)face->line_gap * fVar6;
  }
  if (extents != (plutovg_rect_t *)0x0) {
    uVar1 = face->y1;
    uVar2 = face->x2;
    iVar4 = face->x1;
    iVar5 = face->y2;
    extents->x = fVar6 * (float)iVar4;
    extents->y = -fVar6 * (float)iVar5;
    extents->w = fVar6 * (float)(uVar2 - iVar4);
    extents->h = -fVar6 * (float)(uVar1 - iVar5);
  }
  return;
}

Assistant:

STBTT_DEF float stbtt_ScaleForMappingEmToPixels(const stbtt_fontinfo *info, float pixels)
{
   int unitsPerEm = ttUSHORT(info->data + info->head + 18);
   return pixels / unitsPerEm;
}